

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>::
reserve(vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
        *this,size_t n)

{
  memory_resource *pmVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar5;
  TriangleMesh **ppTVar4;
  
  if (this->nAlloc < n) {
    if (n * 8 == 0) {
      ppTVar4 = (TriangleMesh **)0x0;
    }
    else {
      pmVar1 = (this->alloc).memoryResource;
      iVar3 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
      ppTVar4 = (TriangleMesh **)CONCAT44(extraout_var,iVar3);
    }
    sVar2 = this->nStored;
    if (sVar2 != 0) {
      sVar5 = 0;
      do {
        ppTVar4[sVar5] = this->ptr[sVar5];
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    if (this->ptr != (TriangleMesh **)0x0) {
      pmVar1 = (this->alloc).memoryResource;
      (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,8);
    }
    this->nAlloc = n;
    this->ptr = ppTVar4;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }